

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::ShaderFloatPrecisionCase
          (ShaderFloatPrecisionCase *this,Context *context,char *name,char *desc,char *op,
          EvalFunc evalFunc,Precision precision,Vec2 *rangeA,Vec2 *rangeB,bool isVertexCase)

{
  EvalFunc __s;
  deUint32 seed;
  allocator<char> local_3a;
  byte local_39;
  EvalFunc p_Stack_38;
  bool isVertexCase_local;
  EvalFunc evalFunc_local;
  char *op_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderFloatPrecisionCase *this_local;
  
  local_39 = isVertexCase;
  p_Stack_38 = evalFunc;
  evalFunc_local = (EvalFunc)op;
  op_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  __s = evalFunc_local;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderFloatPrecisionCase_01594ed0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_op,(char *)__s,&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  this->m_evalFunc = p_Stack_38;
  this->m_precision = precision;
  tcu::Vector<float,_2>::Vector(&this->m_rangeA,rangeA);
  tcu::Vector<float,_2>::Vector(&this->m_rangeB,rangeB);
  this->m_isVertexCase = (bool)(local_39 & 1);
  this->m_numTestsPerIter = 0x20;
  this->m_numIters = 4;
  seed = deStringHash(desc_local);
  de::Random::Random(&this->m_rnd,seed);
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffer = 0;
  this->m_renderbuffer = 0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

ShaderFloatPrecisionCase::ShaderFloatPrecisionCase (Context& context, const char* name, const char* desc, const char* op, EvalFunc evalFunc, glu::Precision precision, const tcu::Vec2& rangeA, const tcu::Vec2& rangeB, bool isVertexCase)
	: TestCase			(context, name, desc)
	, m_op				(op)
	, m_evalFunc		(evalFunc)
	, m_precision		(precision)
	, m_rangeA			(rangeA)
	, m_rangeB			(rangeB)
	, m_isVertexCase	(isVertexCase)
	, m_numTestsPerIter	(32)
	, m_numIters		(4)
	, m_rnd				(deStringHash(name))
	, m_program			(DE_NULL)
	, m_framebuffer		(0)
	, m_renderbuffer	(0)
	, m_iterNdx			(0)
{
}